

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

void lws_mqtt_publish_resend(lws_sorted_usec_list *sul)

{
  int iVar1;
  _lws_mqtt_related *mqtt;
  lws_sorted_usec_list *sul_local;
  
  _lws_log(4,"%s: wsi %p\n","lws_mqtt_publish_resend",sul[1].list.prev);
  iVar1 = (*(code *)(sul[1].list.prev[0x17].prev)->next)
                    (sul[1].list.prev,0xd2,sul[1].list.prev[0x19].owner,0);
  if (iVar1 != 0) {
    lws_set_timeout((lws *)sul[1].list.prev,PENDING_TIMEOUT_AWAITING_PROXY_RESPONSE,-1);
  }
  return;
}

Assistant:

static void
lws_mqtt_publish_resend(struct lws_sorted_usec_list *sul)
{
	struct _lws_mqtt_related *mqtt = lws_container_of(sul,
			struct _lws_mqtt_related, sul_qos1_puback_wait);

	lwsl_notice("%s: wsi %p\n", __func__, mqtt->wsi);

	if (mqtt->wsi->protocol->callback(mqtt->wsi, LWS_CALLBACK_MQTT_RESEND,
				mqtt->wsi->user_space, NULL, 0))
		lws_set_timeout(mqtt->wsi, 1, LWS_TO_KILL_ASYNC);
}